

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O0

bool __thiscall
TCMallocImplementation::SetNumericProperty(TCMallocImplementation *this,char *name,size_t value)

{
  int iVar1;
  SpinLock *pSVar2;
  PageHeap *this_00;
  MallocExtension *pMVar3;
  SpinLockHolder local_50;
  SpinLockHolder l_2;
  SpinLockHolder l_1;
  SpinLockHolder local_30;
  SpinLockHolder l;
  size_t value_local;
  char *name_local;
  TCMallocImplementation *this_local;
  
  l.lock_ = (SpinLock *)value;
  iVar1 = strcmp(name,"tcmalloc.max_total_thread_cache_bytes");
  if (iVar1 == 0) {
    pSVar2 = tcmalloc::Static::pageheap_lock();
    SpinLockHolder::SpinLockHolder(&local_30,pSVar2);
    tcmalloc::ThreadCache::set_overall_thread_cache_size((size_t)l.lock_);
    this_local._7_1_ = true;
    SpinLockHolder::~SpinLockHolder(&local_30);
  }
  else {
    iVar1 = strcmp(name,"tcmalloc.min_per_thread_cache_bytes");
    if (iVar1 == 0) {
      tcmalloc::ThreadCache::set_min_per_thread_cache_size((size_t)l.lock_);
      this_local._7_1_ = true;
    }
    else {
      iVar1 = strcmp(name,"tcmalloc.aggressive_memory_decommit");
      if (iVar1 == 0) {
        pSVar2 = tcmalloc::Static::pageheap_lock();
        SpinLockHolder::SpinLockHolder(&l_2,pSVar2);
        this_00 = tcmalloc::Static::pageheap();
        tcmalloc::PageHeap::SetAggressiveDecommit(this_00,l.lock_ != (SpinLock *)0x0);
        this_local._7_1_ = true;
        SpinLockHolder::~SpinLockHolder(&l_2);
      }
      else {
        iVar1 = strcmp(name,"tcmalloc.heap_limit_mb");
        if (iVar1 == 0) {
          pSVar2 = tcmalloc::Static::pageheap_lock();
          SpinLockHolder::SpinLockHolder(&local_50,pSVar2);
          FLAG__namespace_do_not_use_directly_use_DECLARE_int64_t_instead::
          FLAGS_tcmalloc_heap_limit_mb = l.lock_;
          this_local._7_1_ = true;
          SpinLockHolder::~SpinLockHolder(&local_50);
        }
        else {
          iVar1 = strcmp(name,"tcmalloc.sample_parameter");
          if (iVar1 == 0) {
            FLAG__namespace_do_not_use_directly_use_DECLARE_int64_t_instead::
            FLAGS_tcmalloc_sample_parameter = l.lock_;
            pMVar3 = MallocExtension::instance();
            (*pMVar3->_vptr_MallocExtension[0xd])();
            this_local._7_1_ = true;
          }
          else {
            this_local._7_1_ = false;
          }
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

virtual bool SetNumericProperty(const char* name, size_t value) {
    ASSERT(name != nullptr);

    if (strcmp(name, "tcmalloc.max_total_thread_cache_bytes") == 0) {
      SpinLockHolder l(Static::pageheap_lock());
      ThreadCache::set_overall_thread_cache_size(value);
      return true;
    }

    if (strcmp(name, "tcmalloc.min_per_thread_cache_bytes") == 0) {
      ThreadCache::set_min_per_thread_cache_size(value);
      return true;
    }

    if (strcmp(name, "tcmalloc.aggressive_memory_decommit") == 0) {
      SpinLockHolder l(Static::pageheap_lock());
      Static::pageheap()->SetAggressiveDecommit(value != 0);
      return true;
    }

    if (strcmp(name, "tcmalloc.heap_limit_mb") == 0) {
      SpinLockHolder l(Static::pageheap_lock());
      FLAGS_tcmalloc_heap_limit_mb = value;
      return true;
    }

    if (strcmp(name, "tcmalloc.sample_parameter") == 0) {
      FLAGS_tcmalloc_sample_parameter = value;
      // By clearing current thread's cache we force next allocations
      // to read freshly updated sample parameter. This is only going
      // to affect current thread, but this is better than nothing.
      MallocExtension::instance()->MarkThreadIdle();
      return true;
    }

    return false;
  }